

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viface.cpp
# Opt level: O3

void __thiscall viface::VIfaceImpl::setIPv4Broadcast(VIfaceImpl *this,string *broadcast)

{
  int iVar1;
  ostream *poVar2;
  invalid_argument *this_00;
  in_addr addr;
  ostringstream what;
  undefined1 local_1bc [4];
  string local_1b8 [32];
  ostringstream local_198 [376];
  
  iVar1 = inet_pton(2,(broadcast->_M_dataplus)._M_p,local_1bc);
  if (iVar1 != 0) {
    std::__cxx11::string::_M_assign((string *)&this->broadcast);
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"--- Invalid IPv4 address (",0x1a);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,(broadcast->_M_dataplus)._M_p,broadcast->_M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") for ",6);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,(this->name)._M_dataplus._M_p,
                      (this->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
  std::endl<char,std::char_traits<char>>(poVar2);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,local_1b8);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void VIfaceImpl::setIPv4Broadcast(string broadcast)
{
    // Validate format
    struct in_addr addr;

    if (!inet_pton(AF_INET, broadcast.c_str(), &addr)) {
        ostringstream what;
        what << "--- Invalid IPv4 address (" << broadcast << ") for ";
        what << this->name << "." << endl;
        throw invalid_argument(what.str());
    }

    this->broadcast = broadcast;
    return;
}